

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

UnitsMultipliers * __thiscall
libcellml::Analyser::AnalyserImpl::multiplyDivideUnitsMultipliers
          (UnitsMultipliers *__return_storage_ptr__,AnalyserImpl *this,double firstUnitsMultiplier,
          UnitsMultipliers *secondUnitsMultipliers,bool multiply)

{
  bool bVar1;
  double local_58;
  reference local_50;
  double *secondUnitsMultiplier;
  const_iterator __end1;
  const_iterator __begin1;
  UnitsMultipliers *__range1;
  bool multiply_local;
  UnitsMultipliers *secondUnitsMultipliers_local;
  double firstUnitsMultiplier_local;
  AnalyserImpl *this_local;
  UnitsMultipliers *res;
  
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  __end1 = std::vector<double,_std::allocator<double>_>::begin(secondUnitsMultipliers);
  secondUnitsMultiplier =
       (double *)std::vector<double,_std::allocator<double>_>::end(secondUnitsMultipliers);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                                     *)&secondUnitsMultiplier), bVar1) {
    local_50 = __gnu_cxx::
               __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
               operator*(&__end1);
    local_58 = multiplyDivideUnitsMultipliers(this,firstUnitsMultiplier,*local_50,multiply);
    std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,&local_58);
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

UnitsMultipliers Analyser::AnalyserImpl::multiplyDivideUnitsMultipliers(double firstUnitsMultiplier,
                                                                        const UnitsMultipliers &secondUnitsMultipliers,
                                                                        bool multiply)
{
    // Multiply/divide the given units multipliers together, following a
    // multiplication (multiply = true) or a division (multiply = false).

    UnitsMultipliers res;

    for (const auto &secondUnitsMultiplier : secondUnitsMultipliers) {
        res.push_back(multiplyDivideUnitsMultipliers(firstUnitsMultiplier,
                                                     secondUnitsMultiplier,
                                                     multiply));
    }

    return res;
}